

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void av1_loop_restoration_filter_unit
               (RestorationTileLimits *limits,RestorationUnitInfo *rui,
               RestorationStripeBoundaries *rsb,RestorationLineBuffers *rlbs,int plane_w,int plane_h
               ,int ss_x,int ss_y,int highbd,int bit_depth,uint8_t *data8,int stride,uint8_t *dst8,
               int dst_stride,int32_t *tmpbuf,int optimized_lr,aom_internal_error_info *error_info)

{
  int iVar1;
  int iVar2;
  stripe_filter_fun p_Var3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_t __n;
  byte bVar10;
  long lVar11;
  uint8_t *puVar12;
  uint16_t (*__src) [392];
  size_t __n_00;
  int iVar13;
  uint8_t *puVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  RestorationLineBuffers *__dest;
  uint uVar21;
  long lVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  uint8_t *local_148;
  uint8_t *local_140;
  
  iVar1 = limits->v_end;
  iVar13 = limits->v_start;
  uVar7 = iVar1 - iVar13;
  iVar2 = limits->h_start;
  lVar11 = (long)iVar2;
  lVar19 = (long)stride;
  local_148 = data8 + lVar11 + iVar13 * lVar19;
  iVar15 = limits->h_end - iVar2;
  lVar22 = (long)dst_stride;
  local_140 = dst8 + lVar11 + iVar13 * lVar22;
  if (rui->restoration_type == RESTORE_NONE) {
    if (highbd == 0) {
      uVar26 = 0;
      if (0 < (int)uVar7) {
        uVar26 = (ulong)uVar7;
      }
      while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
        memcpy(local_140,local_148,(long)iVar15);
        local_148 = local_148 + lVar19;
        local_140 = local_140 + lVar22;
      }
    }
    else {
      local_148 = (uint8_t *)((long)local_148 * 2);
      local_140 = (uint8_t *)((long)local_140 * 2);
      uVar26 = 0;
      if (0 < (int)uVar7) {
        uVar26 = (ulong)uVar7;
      }
      while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
        memcpy(local_140,local_148,(long)iVar15 * 2);
        local_148 = (uint8_t *)((long)local_148 + lVar19 * 2);
        local_140 = (uint8_t *)((long)local_140 + lVar22 * 2);
      }
    }
  }
  else {
    uVar16 = 0x40 >> ((byte)ss_y & 0x1f);
    uVar21 = 8 >> ((byte)ss_y & 0x1f);
    bVar10 = (byte)highbd;
    p_Var3 = stripe_filters[(int)((uint)(rui->restoration_type == RESTORE_SGRPROJ) + highbd * 2)];
    lVar22 = lVar11 + -4;
    __n = (size_t)(iVar15 + 8 << (bVar10 & 0x1f));
    lVar17 = lVar11 + -4 + lVar19 * -3;
    lVar6 = lVar19 * -3 + lVar22;
    __n_00 = (size_t)((limits->h_end - iVar2) + 8 << (bVar10 & 0x1f));
    lVar11 = lVar19 * 2;
    for (iVar13 = 0; iVar13 < (int)uVar7; iVar13 = iVar13 + iVar4) {
      iVar18 = limits->v_start + iVar13;
      uVar8 = 0;
      if (iVar18 == 0) {
        uVar8 = uVar21;
      }
      iVar20 = (iVar18 + uVar16) - uVar8;
      iVar9 = (int)(iVar18 + uVar21) / (int)uVar16;
      uVar8 = 0;
      if (iVar9 == 0) {
        uVar8 = uVar21;
      }
      iVar4 = iVar1 - iVar18;
      if ((int)(uVar16 - uVar8) < iVar1 - iVar18) {
        iVar4 = uVar16 - uVar8;
      }
      if (optimized_lr == 0) {
        uVar8 = iVar9 * 2;
        iVar9 = rsb->stripe_boundary_stride;
        if (iVar18 != 0) {
          puVar24 = data8 + iVar18 * stride + lVar17;
          puVar12 = (uint8_t *)((long)(data8 + iVar18 * stride + lVar6) * 2);
          __dest = rlbs;
          for (lVar25 = -3; lVar25 != 0; lVar25 = lVar25 + 1) {
            iVar5 = -2;
            if ((int)lVar25 == -1) {
              iVar5 = -1;
            }
            puVar14 = rsb->stripe_boundary_above;
            puVar23 = puVar12;
            if (highbd == 0) {
              puVar23 = puVar24;
            }
            memcpy(__dest,puVar23,__n);
            memcpy(puVar23,puVar14 + (int)((iVar5 + uVar8 + 2) * iVar9 + iVar2 << (bVar10 & 0x1f)),
                   __n);
            __dest = (RestorationLineBuffers *)(__dest->tmp_save_above + 1);
            puVar24 = puVar24 + lVar19;
            puVar12 = puVar12 + lVar11;
          }
        }
        if (iVar20 < plane_h) {
          lVar25 = (long)((iVar4 + iVar18) * stride);
          puVar24 = data8 + lVar25 + lVar22;
          puVar12 = (uint8_t *)((long)(data8 + lVar25 + lVar22) * 2);
          for (lVar25 = 0; lVar25 != 0x930; lVar25 = lVar25 + 0x310) {
            puVar14 = rsb->stripe_boundary_below;
            puVar23 = puVar12;
            if (highbd == 0) {
              puVar23 = puVar24;
            }
            memcpy((void *)((long)rlbs->tmp_save_below[0] + lVar25),puVar23,__n);
            memcpy(puVar23,puVar14 + (int)((lVar25 != 0 | uVar8) * iVar9 + iVar2 << (bVar10 & 0x1f))
                   ,__n);
            puVar24 = puVar24 + lVar19;
            puVar12 = puVar12 + lVar11;
          }
        }
      }
      else {
        if (iVar18 != 0) {
          lVar25 = iVar18 * stride + lVar22;
          puVar12 = (uint8_t *)((long)(data8 + stride * -2 + lVar25) * 2);
          puVar24 = (uint8_t *)((long)(data8 + stride * -3 + lVar25) * 2);
          if (highbd == 0) {
            puVar12 = data8 + stride * -2 + lVar25;
            puVar24 = data8 + stride * -3 + lVar25;
          }
          memcpy(rlbs,puVar24,__n);
          memcpy(puVar24,puVar12,__n);
        }
        if (iVar20 < plane_h) {
          lVar25 = (iVar4 + iVar18) * stride + lVar22;
          puVar12 = (uint8_t *)((long)(data8 + lVar19 + lVar25) * 2);
          puVar24 = (uint8_t *)((long)(data8 + stride * 2 + lVar25) * 2);
          if (highbd == 0) {
            puVar12 = data8 + lVar19 + lVar25;
            puVar24 = data8 + stride * 2 + lVar25;
          }
          memcpy(rlbs->tmp_save_below + 2,puVar24,__n);
          memcpy(puVar24,puVar12,__n);
        }
      }
      (*p_Var3)(rui,iVar15,iVar4,0x40 >> ((byte)ss_x & 0x1f),local_148 + iVar13 * stride,stride,
                local_140 + iVar13 * dst_stride,dst_stride,tmpbuf,bit_depth,error_info);
      if (optimized_lr == 0) {
        if (iVar18 != 0) {
          puVar24 = data8 + iVar18 * stride + lVar17;
          puVar12 = (uint8_t *)((long)(data8 + iVar18 * stride + lVar6) * 2);
          for (lVar25 = 0; lVar25 != 0x930; lVar25 = lVar25 + 0x310) {
            puVar14 = puVar12;
            if (highbd == 0) {
              puVar14 = puVar24;
            }
            memcpy(puVar14,(void *)((long)rlbs->tmp_save_above[0] + lVar25),__n_00);
            puVar24 = puVar24 + lVar19;
            puVar12 = puVar12 + lVar11;
          }
        }
        if (iVar20 < plane_h) {
          lVar25 = (long)((iVar18 + iVar4) * stride);
          puVar24 = data8 + lVar25 + lVar22;
          puVar12 = (uint8_t *)((long)(data8 + lVar25 + lVar22) * 2);
          __src = rlbs->tmp_save_below;
          for (lVar25 = 0; (lVar25 != 3 && (lVar25 < ((long)iVar1 + 3) - (long)(iVar18 + iVar4)));
              lVar25 = lVar25 + 1) {
            puVar14 = puVar12;
            if (highbd == 0) {
              puVar14 = puVar24;
            }
            memcpy(puVar14,__src,__n_00);
            __src = __src + 1;
            puVar24 = puVar24 + lVar19;
            puVar12 = puVar12 + lVar11;
          }
        }
      }
      else {
        if (iVar18 != 0) {
          puVar24 = (uint8_t *)((long)(data8 + (long)(iVar18 * stride) + stride * -3 + lVar22) * 2);
          if (highbd == 0) {
            puVar24 = data8 + (long)(iVar18 * stride) + stride * -3 + lVar22;
          }
          memcpy(puVar24,rlbs,__n_00);
        }
        if ((iVar20 < plane_h) && (iVar18 + iVar4 <= iVar1)) {
          puVar24 = (uint8_t *)
                    ((long)(data8 + (long)((iVar18 + iVar4) * stride) + stride * 2 + lVar22) * 2);
          if (highbd == 0) {
            puVar24 = data8 + (long)((iVar18 + iVar4) * stride) + stride * 2 + lVar22;
          }
          memcpy(puVar24,rlbs->tmp_save_below + 2,__n_00);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_unit(
    const RestorationTileLimits *limits, const RestorationUnitInfo *rui,
    const RestorationStripeBoundaries *rsb, RestorationLineBuffers *rlbs,
    int plane_w, int plane_h, int ss_x, int ss_y, int highbd, int bit_depth,
    uint8_t *data8, int stride, uint8_t *dst8, int dst_stride, int32_t *tmpbuf,
    int optimized_lr, struct aom_internal_error_info *error_info) {
  RestorationType unit_rtype = rui->restoration_type;

  int unit_h = limits->v_end - limits->v_start;
  int unit_w = limits->h_end - limits->h_start;
  uint8_t *data8_tl =
      data8 + limits->v_start * (ptrdiff_t)stride + limits->h_start;
  uint8_t *dst8_tl =
      dst8 + limits->v_start * (ptrdiff_t)dst_stride + limits->h_start;

  if (unit_rtype == RESTORE_NONE) {
    copy_rest_unit(unit_w, unit_h, data8_tl, stride, dst8_tl, dst_stride,
                   highbd);
    return;
  }

  const int filter_idx = 2 * highbd + (unit_rtype == RESTORE_SGRPROJ);
  assert(filter_idx < NUM_STRIPE_FILTERS);
  const stripe_filter_fun stripe_filter = stripe_filters[filter_idx];

  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;

  // Filter the whole image one stripe at a time
  RestorationTileLimits remaining_stripes = *limits;
  int i = 0;
  while (i < unit_h) {
    int copy_above, copy_below;
    remaining_stripes.v_start = limits->v_start + i;

    get_stripe_boundary_info(&remaining_stripes, plane_w, plane_h, ss_y,
                             &copy_above, &copy_below);

    const int full_stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
    const int runit_offset = RESTORATION_UNIT_OFFSET >> ss_y;

    // Work out where this stripe's boundaries are within
    // rsb->stripe_boundary_{above,below}
    const int frame_stripe =
        (remaining_stripes.v_start + runit_offset) / full_stripe_height;
    const int rsb_row = RESTORATION_CTX_VERT * frame_stripe;

    // Calculate this stripe's height, based on two rules:
    // * The topmost stripe in the frame is 8 luma pixels shorter than usual.
    // * We can't extend past the end of the current restoration unit
    const int nominal_stripe_height =
        full_stripe_height - ((frame_stripe == 0) ? runit_offset : 0);
    const int h = AOMMIN(nominal_stripe_height,
                         remaining_stripes.v_end - remaining_stripes.v_start);

    setup_processing_stripe_boundary(&remaining_stripes, rsb, rsb_row, highbd,
                                     h, data8, stride, rlbs, copy_above,
                                     copy_below, optimized_lr);

    stripe_filter(rui, unit_w, h, procunit_width, data8_tl + i * stride, stride,
                  dst8_tl + i * dst_stride, dst_stride, tmpbuf, bit_depth,
                  error_info);

    restore_processing_stripe_boundary(&remaining_stripes, rlbs, highbd, h,
                                       data8, stride, copy_above, copy_below,
                                       optimized_lr);

    i += h;
  }
}